

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

void des3_cbc1_cbc_encrypt(ssh_cipher *ciph,void *vdata,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined1 *puVar5;
  uint uVar6;
  ulong uVar7;
  LR LVar8;
  
  if (0 < len) {
    iVar4 = len + 8;
    puVar5 = (undefined1 *)((long)vdata + 7);
    do {
      uVar1 = *(uint *)(puVar5 + -7);
      uVar7 = CONCAT17(puVar5[-3],
                       CONCAT16(puVar5[-2],
                                CONCAT15(puVar5[-1],
                                         CONCAT14(*puVar5,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                                          (uVar1 & 0xff00) << 8 | uVar1 << 0x18))))
              ^ (ulong)ciph[-1].vt;
      uVar1 = (uint)(uVar7 >> 0x20);
      uVar2 = ((uint)(uVar7 >> 4) & 0xfffffff ^ uVar1) & 0xf0f0f0f;
      uVar3 = uVar2 << 4 ^ (uint)uVar7;
      uVar2 = uVar2 ^ uVar1;
      uVar6 = uVar2 & 0xffff ^ uVar3 >> 0x10;
      uVar3 = uVar6 << 0x10 ^ uVar3;
      uVar6 = uVar6 ^ uVar2;
      uVar2 = (uVar6 >> 2 ^ uVar3) & 0x33333333;
      uVar6 = uVar2 * 4 ^ uVar6;
      uVar2 = uVar2 ^ uVar3;
      uVar1 = (uVar6 >> 8 ^ uVar2) & 0xff00ff;
      uVar6 = uVar1 << 8 ^ uVar6;
      uVar1 = uVar1 ^ uVar2;
      uVar3 = (uVar1 >> 1 ^ uVar6) & 0x55555555;
      uVar1 = uVar3 * 2 ^ uVar1;
      uVar3 = uVar3 ^ uVar6;
      LVar8.L = uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f;
      LVar8.R = uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f;
      LVar8 = des_inner_cipher(LVar8,(des_keysched *)(ciph + -0x31),0,1);
      LVar8 = des_inner_cipher(LVar8,(des_keysched *)(ciph + -0x21),0xf,0xffffffffffffffff);
      LVar8 = des_inner_cipher(LVar8,(des_keysched *)(ciph + -0x11),0,1);
      uVar1 = LVar8.L;
      uVar3 = LVar8.R << 1 | (uint)((long)LVar8 < 0);
      uVar2 = (uVar1 & 0x7fffffff ^ uVar3) & 0x55555555;
      uVar6 = uVar2 * 2 ^ (uVar1 << 1 | (uint)((int)uVar1 < 0));
      uVar2 = uVar2 ^ uVar3;
      uVar1 = (uVar2 >> 8 ^ uVar6) & 0xff00ff;
      uVar2 = uVar1 << 8 ^ uVar2;
      uVar1 = uVar1 ^ uVar6;
      uVar6 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
      uVar2 = uVar6 * 4 ^ uVar2;
      uVar6 = uVar6 ^ uVar1;
      uVar3 = uVar2 & 0xffff ^ uVar6 >> 0x10;
      uVar6 = uVar3 << 0x10 ^ uVar6;
      uVar3 = uVar3 ^ uVar2;
      uVar1 = (uVar6 >> 4 ^ uVar3) & 0xf0f0f0f;
      uVar6 = uVar1 << 4 ^ uVar6;
      uVar1 = uVar1 ^ uVar3;
      *(ushort *)(puVar5 + -5) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      puVar5[-6] = (char)(uVar6 >> 0x10);
      puVar5[-7] = (char)(uVar6 >> 0x18);
      *puVar5 = (char)uVar1;
      puVar5[-1] = (char)(uVar1 >> 8);
      puVar5[-2] = (char)(uVar1 >> 0x10);
      puVar5[-3] = (char)(uVar1 >> 0x18);
      ciph[-1].vt = (ssh_cipheralg *)CONCAT44(uVar1,uVar6);
      iVar4 = iVar4 + -8;
      puVar5 = puVar5 + 8;
    } while (8 < iVar4);
  }
  return;
}

Assistant:

static void des3_cbc1_cbc_encrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc1_ctx *ctx = container_of(ciph, struct des3_cbc1_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR plaintext = des_load_lr(data);
        LR cipher_in = des_xor_lr(plaintext, ctx->iv);

        /* Run three copies of the cipher, without undoing and redoing
         * IP/FP in between. */
        LR lr = des_IP(cipher_in);
        lr = des_inner_cipher(lr, &ctx->sched[0], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[2], ENCIPHER);
        LR ciphertext = des_FP(lr);

        des_store_lr(data, ciphertext);
        ctx->iv = ciphertext;
    }
}